

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
diligent_spirv_cross::CompilerGLSL::remap_swizzle
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *out_type,
          uint32_t input_components,string *expr)

{
  char (*in_R9) [2];
  uint32_t c;
  uint uVar1;
  string local_50;
  
  if (out_type->vecsize == input_components) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)expr);
  }
  else if ((input_components == 1) && ((this->backend).can_swizzle_scalar == false)) {
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_50,this,out_type,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
              (__return_storage_ptr__,(diligent_spirv_cross *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6fe2e7,
               (char (*) [2])expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x801c00,in_R9);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    enclose_expression(&local_50,this,expr);
    ::std::operator+(__return_storage_ptr__,&local_50,".");
    ::std::__cxx11::string::~string((string *)&local_50);
    for (uVar1 = 0; uVar1 < out_type->vecsize; uVar1 = uVar1 + 1) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((1 < out_type->vecsize) && ((this->backend).swizzle_is_function != false)) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    remove_duplicate_swizzle(this,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::remap_swizzle(const SPIRType &out_type, uint32_t input_components, const string &expr)
{
	if (out_type.vecsize == input_components)
		return expr;
	else if (input_components == 1 && !backend.can_swizzle_scalar)
		return join(type_to_glsl(out_type), "(", expr, ")");
	else
	{
		// FIXME: This will not work with packed expressions.
		auto e = enclose_expression(expr) + ".";
		// Just clamp the swizzle index if we have more outputs than inputs.
		for (uint32_t c = 0; c < out_type.vecsize; c++)
			e += index_to_swizzle(min(c, input_components - 1));
		if (backend.swizzle_is_function && out_type.vecsize > 1)
			e += "()";

		remove_duplicate_swizzle(e);
		return e;
	}
}